

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.cpp
# Opt level: O3

void __thiscall
pbrt::RGBFilm::RGBFilm
          (RGBFilm *this,FilmBaseParameters *p,RGBColorSpace *colorSpace,Float maxComponentValue,
          bool writeFP16,Allocator alloc)

{
  Float *pFVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  pointer pcVar5;
  ulong uVar6;
  PixelSensor *pPVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined1 (*pauVar10) [64];
  int i;
  uint uVar11;
  int iVar12;
  long lVar13;
  int iVar14;
  SquareMatrix<3> *pSVar15;
  PixelSensor *pPVar16;
  GaussianFilter *this_00;
  LanczosSincFilter *this_01;
  long lVar17;
  PixelSensor *pPVar18;
  int k;
  long lVar19;
  long in_FS_OFFSET;
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  float fVar23;
  undefined1 auVar24 [16];
  SquareMatrix<3> r;
  undefined1 auStack_b8 [8];
  Float local_b0;
  Float local_ac [9];
  undefined1 auStack_88 [48];
  _Alloc_hider local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  
  auStack_88._16_8_ = (p->pixelBounds).pMax.super_Tuple2<pbrt::Point2,_int>;
  auStack_88._0_8_ = (p->fullResolution).super_Tuple2<pbrt::Point2,_int>;
  auStack_88._8_8_ = (p->pixelBounds).pMin.super_Tuple2<pbrt::Point2,_int>;
  auStack_88._24_8_ =
       (p->filter).
       super_TaggedPointer<pbrt::BoxFilter,_pbrt::GaussianFilter,_pbrt::MitchellFilter,_pbrt::LanczosSincFilter,_pbrt::TriangleFilter>
       .bits;
  auStack_88._32_4_ = p->diagonal;
  auStack_88._36_4_ = *(undefined4 *)&p->field_0x24;
  auStack_88._40_8_ = p->sensor;
  pcVar5 = (p->filename)._M_dataplus._M_p;
  local_b0 = maxComponentValue;
  local_58._M_p = (pointer)&local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar5,pcVar5 + (p->filename)._M_string_length);
  FilmBase::FilmBase(&this->super_FilmBase,(FilmBaseParameters *)auStack_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_p != &local_48) {
    operator_delete(local_58._M_p,local_48._M_allocated_capacity + 1);
  }
  this->colorSpace = colorSpace;
  lVar13 = 0;
  this->maxComponentValue = local_b0;
  this->writeFP16 = writeFP16;
  pSVar15 = &this->outputRGBFromSensorRGB;
  do {
    auVar20 = vpbroadcastq_avx512f();
    uVar8 = vpcmpeqq_avx512f(auVar20,_DAT_02d6f100);
    uVar9 = vpcmpeqq_avx512f(auVar20,_DAT_02d6f140);
    lVar13 = lVar13 + 1;
    auVar20 = vpmovm2d_avx512dq((ulong)CONCAT11((char)uVar9,(char)uVar8));
    auVar20 = vpsrld_avx512f(auVar20,0x1f);
    auVar20 = vcvtdq2ps_avx512f(auVar20);
    auVar20._12_4_ = pSVar15->m[1][0];
    auVar20._16_4_ = pSVar15->m[1][1];
    auVar20._20_4_ = pSVar15->m[1][2];
    auVar20._24_4_ = pSVar15->m[2][0];
    auVar20._28_4_ = pSVar15->m[2][1];
    auVar20._32_4_ = pSVar15->m[2][2];
    auVar20._36_4_ =
         (((Array2D<pbrt::RGBFilm::Pixel> *)(pSVar15 + 1))->extent).pMin.
         super_Tuple2<pbrt::Point2,_int>.x;
    auVar20._40_4_ =
         (((Array2D<pbrt::RGBFilm::Pixel> *)(pSVar15 + 1))->extent).pMin.
         super_Tuple2<pbrt::Point2,_int>.y;
    auVar20._44_4_ =
         (((Array2D<pbrt::RGBFilm::Pixel> *)(pSVar15 + 1))->extent).pMax.
         super_Tuple2<pbrt::Point2,_int>.x;
    auVar20._48_4_ =
         (((Array2D<pbrt::RGBFilm::Pixel> *)(pSVar15 + 1))->extent).pMax.
         super_Tuple2<pbrt::Point2,_int>.y;
    auVar20._52_4_ =
         *(undefined4 *)
          &(((Array2D<pbrt::RGBFilm::Pixel> *)(pSVar15 + 1))->allocator).memoryResource;
    auVar20._56_4_ =
         *(undefined4 *)
          ((long)&(((Array2D<pbrt::RGBFilm::Pixel> *)(pSVar15 + 1))->allocator).memoryResource + 4);
    auVar20._60_4_ = *(undefined4 *)&((Array2D<pbrt::RGBFilm::Pixel> *)(pSVar15 + 1))->values;
    *(undefined1 (*) [64])pSVar15 = auVar20;
    pSVar15 = (SquareMatrix<3> *)(pSVar15->m + 1);
  } while (lVar13 != 3);
  Array2D<pbrt::RGBFilm::Pixel>::Array2D
            (&this->pixels,&p->pixelBounds,(allocator_type)alloc.memoryResource);
  uVar6 = (this->super_FilmBase).filter.
          super_TaggedPointer<pbrt::BoxFilter,_pbrt::GaussianFilter,_pbrt::MitchellFilter,_pbrt::LanczosSincFilter,_pbrt::TriangleFilter>
          .bits;
  uVar11 = (uint)(ushort)(uVar6 >> 0x30);
  if (uVar6 >> 0x30 < 3) {
    this_00 = (GaussianFilter *)(uVar6 & 0xffffffffffff);
    if (uVar11 == 2) {
      fVar23 = GaussianFilter::Integral(this_00);
    }
    else {
      fVar2 = (this_00->radius).super_Tuple2<pbrt::Vector2,_float>.x;
      fVar2 = fVar2 + fVar2;
      fVar23 = (fVar2 + fVar2) * (this_00->radius).super_Tuple2<pbrt::Vector2,_float>.y;
    }
  }
  else {
    uVar11 = uVar11 - 2;
    this_01 = (LanczosSincFilter *)(uVar6 & 0xffffffffffff);
    if (uVar11 < 2) {
      fVar23 = (this_01->radius).super_Tuple2<pbrt::Vector2,_float>.x *
               (this_01->radius).super_Tuple2<pbrt::Vector2,_float>.y * 0.25;
    }
    else if (uVar11 == 2) {
      fVar23 = LanczosSincFilter::Integral(this_01);
    }
    else {
      fVar2 = (this_01->radius).super_Tuple2<pbrt::Vector2,_float>.x;
      fVar23 = (this_01->radius).super_Tuple2<pbrt::Vector2,_float>.y;
      fVar23 = fVar23 * fVar2 * fVar2 * fVar23;
    }
  }
  this->filterIntegral = fVar23;
  iVar3 = (this->super_FilmBase).pixelBounds.pMax.super_Tuple2<pbrt::Point2,_int>.x;
  iVar4 = (this->super_FilmBase).pixelBounds.pMin.super_Tuple2<pbrt::Point2,_int>.x;
  iVar12 = iVar3 - iVar4;
  if ((iVar12 != 0 && iVar4 <= iVar3) &&
     (iVar3 = (this->super_FilmBase).pixelBounds.pMax.super_Tuple2<pbrt::Point2,_int>.y,
     iVar4 = (this->super_FilmBase).pixelBounds.pMin.super_Tuple2<pbrt::Point2,_int>.y,
     iVar14 = iVar3 - iVar4, iVar14 != 0 && iVar4 <= iVar3)) {
    if (colorSpace != (RGBColorSpace *)0x0) {
      auVar20 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar21 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      lVar13 = 0;
      *(long *)(in_FS_OFFSET + -8) = *(long *)(in_FS_OFFSET + -8) + (long)(iVar14 * iVar12) * 0x38;
      pPVar7 = (this->super_FilmBase).sensor;
      pauVar10 = (undefined1 (*) [64])auStack_b8;
      do {
        auVar22 = vpbroadcastq_avx512f();
        lVar13 = lVar13 + 1;
        uVar8 = vpcmpeqq_avx512f(auVar22,auVar20);
        uVar9 = vpcmpeqq_avx512f(auVar22,auVar21);
        auVar22 = vpmovm2d_avx512dq((ulong)CONCAT11((char)uVar9,(char)uVar8));
        auVar22 = vpsrld_avx512f(auVar22,0x1f);
        auVar22 = vcvtdq2ps_avx512f(auVar22);
        auVar22._12_4_ = *(undefined4 *)(*pauVar10 + 0x18);
        auVar22._16_4_ = *(undefined4 *)(*pauVar10 + 0x1c);
        auVar22._20_4_ = *(undefined4 *)(*pauVar10 + 0x20);
        auVar22._24_4_ = *(undefined4 *)(*pauVar10 + 0x24);
        auVar22._28_4_ = *(undefined4 *)(*pauVar10 + 0x28);
        auVar22._32_4_ = *(undefined4 *)(*pauVar10 + 0x2c);
        auVar22._36_4_ = *(undefined4 *)(*pauVar10 + 0x30);
        auVar22._40_4_ = *(undefined4 *)(*pauVar10 + 0x34);
        auVar22._44_4_ = *(undefined4 *)(*pauVar10 + 0x38);
        auVar22._48_4_ = *(undefined4 *)(*pauVar10 + 0x3c);
        auVar22._52_4_ = *(undefined4 *)pauVar10[1];
        auVar22._56_4_ = *(undefined4 *)(pauVar10[1] + 4);
        auVar22._60_4_ = *(undefined4 *)(pauVar10[1] + 8);
        *(undefined1 (*) [64])(*pauVar10 + 0xc) = auVar22;
        pauVar10 = (undefined1 (*) [64])(*pauVar10 + 0xc);
      } while (lVar13 != 3);
      pSVar15 = &colorSpace->RGBFromXYZ;
      lVar13 = 0;
      do {
        lVar17 = 0;
        pPVar16 = pPVar7;
        do {
          auVar24 = ZEXT816(0) << 0x40;
          lVar19 = 0;
          pPVar18 = pPVar16;
          do {
            pFVar1 = pSVar15->m[0] + lVar19;
            lVar19 = lVar19 + 1;
            auVar24 = vfmadd231ss_fma(auVar24,ZEXT416((uint)*pFVar1),
                                      ZEXT416((uint)(pPVar18->XYZFromSensorRGB).m[0][0]));
            pPVar18 = (PixelSensor *)((pPVar18->XYZFromSensorRGB).m + 1);
          } while (lVar19 != 3);
          local_ac[lVar13 * 3 + lVar17] = auVar24._0_4_;
          lVar17 = lVar17 + 1;
          pPVar16 = (PixelSensor *)((pPVar16->XYZFromSensorRGB).m[0] + 1);
        } while (lVar17 != 3);
        lVar13 = lVar13 + 1;
        pSVar15 = (SquareMatrix<3> *)(pSVar15->m + 1);
      } while (lVar13 != 3);
      (this->outputRGBFromSensorRGB).m[2][2] = local_ac[8];
      *(undefined8 *)(this->outputRGBFromSensorRGB).m[0] = local_ac._0_8_;
      *(undefined8 *)((this->outputRGBFromSensorRGB).m[0] + 2) = local_ac._8_8_;
      *(undefined8 *)((this->outputRGBFromSensorRGB).m[1] + 1) = local_ac._16_8_;
      *(undefined8 *)(this->outputRGBFromSensorRGB).m[2] = local_ac._24_8_;
      return;
    }
    LogFatal<char_const(&)[22]>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/film.cpp"
               ,500,"Check failed: %s",(char (*) [22])"colorSpace != nullptr");
  }
  LogFatal<char_const(&)[23]>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/film.cpp"
             ,499,"Check failed: %s",(char (*) [23])"!pixelBounds.IsEmpty()");
}

Assistant:

RGBFilm::RGBFilm(FilmBaseParameters p, const RGBColorSpace *colorSpace,
                 Float maxComponentValue, bool writeFP16, Allocator alloc)
    : FilmBase(p),
      pixels(p.pixelBounds, alloc),
      colorSpace(colorSpace),
      maxComponentValue(maxComponentValue),
      writeFP16(writeFP16) {
    filterIntegral = filter.Integral();
    CHECK(!pixelBounds.IsEmpty());
    CHECK(colorSpace != nullptr);
    filmPixelMemory += pixelBounds.Area() * sizeof(Pixel);
    outputRGBFromSensorRGB = colorSpace->RGBFromXYZ * sensor->XYZFromSensorRGB;
}